

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

Vec_Ptr_t * Gia_ManDeriveDivs(Vec_Wrd_t *vSims,int nWords)

{
  int iVar1;
  Vec_Ptr_t *p;
  word *Entry;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (long)vSims->nSize / (long)nWords;
  iVar1 = (int)uVar2;
  p = Vec_PtrAlloc(iVar1);
  uVar3 = 0;
  uVar2 = uVar2 & 0xffffffff;
  if (iVar1 < 1) {
    uVar2 = uVar3;
  }
  while (iVar1 = (int)uVar2, uVar2 = (ulong)(iVar1 - 1), iVar1 != 0) {
    Entry = Vec_WrdEntryP(vSims,(int)uVar3);
    Vec_PtrPush(p,Entry);
    uVar3 = (ulong)(uint)((int)uVar3 + nWords);
  }
  return p;
}

Assistant:

Vec_Ptr_t * Gia_ManDeriveDivs( Vec_Wrd_t * vSims, int nWords )
{
    int i, nDivs = Vec_WrdSize(vSims)/nWords;
    Vec_Ptr_t * vDivs = Vec_PtrAlloc( nDivs );
    for ( i = 0; i < nDivs; i++ )
        Vec_PtrPush( vDivs, Vec_WrdEntryP(vSims, nWords*i) );
    return vDivs;
}